

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week3-app2.cpp
# Opt level: O3

void __thiscall FancyInteger::print_fancy(FancyInteger *this)

{
  long *plVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"----------------",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,(this->super_Integer).value);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"----------------",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  return;
}

Assistant:

void print_fancy() // member-function
    {
        std::cout << "----------------" << std::endl;
        std::cout << value << std::endl;
        std::cout << "----------------" << std::endl;
    }